

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookbook.c
# Opt level: O2

void readimage(void)

{
  float fVar1;
  float fVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  int status;
  fitsfile *fptr;
  float local_100c;
  float local_1008;
  float nullval;
  int anynull;
  int nfound;
  long naxes [2];
  char filename [13];
  float buffer [1000];
  
  builtin_strncpy(filename + 8,".fit",5);
  builtin_strncpy(filename,"atestfil",8);
  status = 0;
  iVar3 = ffopentest(10,&fptr,filename,0);
  if (iVar3 != 0) {
    printerror(status);
  }
  iVar3 = ffgknj(fptr,"NAXIS",1,2,naxes,&nfound,&status);
  if (iVar3 != 0) {
    printerror(status);
  }
  nullval = 0.0;
  fVar8 = -1e+30;
  fVar9 = 1e+30;
  lVar7 = 1;
  for (uVar5 = naxes[1] * naxes[0]; 0 < (long)uVar5; uVar5 = uVar5 - uVar6) {
    uVar6 = 1000;
    if (uVar5 < 1000) {
      uVar6 = uVar5;
    }
    local_100c = fVar9;
    local_1008 = fVar8;
    iVar3 = ffgpv(fptr,0x2a,lVar7,uVar6,&nullval,buffer,&anynull,&status);
    if (iVar3 != 0) {
      printerror(status);
    }
    fVar8 = local_1008;
    fVar9 = local_100c;
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      fVar1 = buffer[uVar4];
      fVar2 = fVar1;
      if (fVar9 <= fVar1) {
        fVar2 = fVar9;
      }
      fVar9 = fVar2;
      if (fVar1 <= fVar8) {
        fVar1 = fVar8;
      }
      fVar8 = fVar1;
    }
    lVar7 = lVar7 + uVar6;
  }
  printf("\nMin and max image pixels =  %.0f, %.0f\n",(double)fVar9,(double)fVar8);
  iVar3 = ffclos(fptr,&status);
  if (iVar3 != 0) {
    printerror(status);
  }
  return;
}

Assistant:

void readimage( void )

    /************************************************************************/
    /* Read a FITS image and determine the minimum and maximum pixel values */
    /************************************************************************/
{
    fitsfile *fptr;       /* pointer to the FITS file, defined in fitsio.h */
    int status,  nfound, anynull;
    long naxes[2], fpixel, nbuffer, npixels, ii;

#define buffsize 1000
    float datamin, datamax, nullval, buffer[buffsize];
    char filename[]  = "atestfil.fit";     /* name of existing FITS file   */

    status = 0;

    if ( fits_open_file(&fptr, filename, READONLY, &status) )
         printerror( status );

    /* read the NAXIS1 and NAXIS2 keyword to get image size */
    if ( fits_read_keys_lng(fptr, "NAXIS", 1, 2, naxes, &nfound, &status) )
         printerror( status );

    npixels  = naxes[0] * naxes[1];         /* number of pixels in the image */
    fpixel   = 1;
    nullval  = 0;                /* don't check for null values in the image */
    datamin  = 1.0E30f;
    datamax  = -1.0E30f;

    while (npixels > 0)
    {
      nbuffer = npixels;
      if (npixels > buffsize)
        nbuffer = buffsize;     /* read as many pixels as will fit in buffer */

      /* Note that even though the FITS images contains unsigned integer */
      /* pixel values (or more accurately, signed integer pixels with    */
      /* a bias of 32768),  this routine is reading the values into a    */
      /* float array.   Cfitsio automatically performs the datatype      */
      /* conversion in cases like this.                                  */

      if ( fits_read_img(fptr, TFLOAT, fpixel, nbuffer, &nullval,
                  buffer, &anynull, &status) )
           printerror( status );

      for (ii = 0; ii < nbuffer; ii++)  {
        if ( buffer[ii] < datamin )
            datamin = buffer[ii];

        if ( buffer[ii] > datamax )
            datamax = buffer[ii];
      }
      npixels -= nbuffer;    /* increment remaining number of pixels */
      fpixel  += nbuffer;    /* next pixel to be read in image */
    }

    printf("\nMin and max image pixels =  %.0f, %.0f\n", datamin, datamax);

    if ( fits_close_file(fptr, &status) )
         printerror( status );

    return;
}